

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O0

double __thiscall ON_Light::Attenuation(ON_Light *this,double d)

{
  double local_20;
  double a;
  double d_local;
  ON_Light *this_local;
  
  local_20 = d * (d * (this->m_attenuation).z + (this->m_attenuation).y) + (this->m_attenuation).x;
  if (local_20 <= 0.0) {
    local_20 = 0.0;
  }
  else {
    local_20 = 1.0 / local_20;
  }
  return local_20;
}

Assistant:

double ON_Light::Attenuation(double d) const
{
  // computes 1/(a[0] + d*a[1] + d^2*a[2]) where d = argument
  // returns 0 if a[0] + d*a[1] + d^2*a[2] <= 0
  double a = m_attenuation.x + d*(m_attenuation.y + d*m_attenuation.z);
  if ( a > 0.0 )
    a = 1.0/a;
  else
    a = 0.0;
  return a;
}